

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cpp
# Opt level: O0

bool __thiscall Filesystem::add_fcb(Filesystem *this,int firstId,Fcb fcb)

{
  int id;
  unsigned_short *puVar1;
  size_type sVar2;
  ostream *this_00;
  int freeBlock;
  Document *local_28;
  Document *plastDoc;
  int lastId;
  int firstId_local;
  Filesystem *this_local;
  
  puVar1 = Fat::operator[](this->pfat1,firstId);
  plastDoc._0_4_ = firstId;
  if (*puVar1 == 0) {
    puVar1 = Fat::operator[](this->pfat1,firstId);
    *puVar1 = 0xffff;
  }
  while (puVar1 = Fat::operator[](this->pfat1,(uint)plastDoc), *puVar1 != 0xffff) {
    puVar1 = Fat::operator[](this->pfat1,(uint)plastDoc);
    plastDoc._0_4_ = (uint)*puVar1;
  }
  local_28 = (Document *)operator_new(0x20);
  Document::Document(local_28,this->blocks[(int)(uint)plastDoc]);
  sVar2 = std::vector<Fcb,_std::allocator<Fcb>_>::size
                    ((vector<Fcb,_std::allocator<Fcb>_> *)local_28);
  if ((sVar2 + 1) * 0x28 < 0x400) {
    std::vector<Fcb,_std::allocator<Fcb>_>::push_back
              ((vector<Fcb,_std::allocator<Fcb>_> *)local_28,&fcb);
  }
  else {
    id = Fat::get_FreeBlock(this->pfat1);
    if (id == -1) {
      this_00 = std::operator<<((ostream *)&std::cout,"[Err]Current content is full!");
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      return false;
    }
    puVar1 = Fat::operator[](this->pfat1,(uint)plastDoc);
    *puVar1 = (unsigned_short)id;
    puVar1 = Fat::operator[](this->pfat1,id);
    *puVar1 = 0xffff;
    if (local_28 != (Document *)0x0) {
      Document::~Document(local_28);
      operator_delete(local_28,0x20);
    }
    local_28 = (Document *)operator_new(0x20);
    Document::Document(local_28,this->blocks[(int)(uint)plastDoc]);
    std::vector<Fcb,_std::allocator<Fcb>_>::push_back
              ((vector<Fcb,_std::allocator<Fcb>_> *)local_28,&fcb);
  }
  if (local_28 != (Document *)0x0) {
    Document::~Document(local_28);
    operator_delete(local_28,0x20);
  }
  return true;
}

Assistant:

bool Filesystem::add_fcb(int firstId,Fcb fcb)
{
    ///Step1
    int lastId = firstId;
    if ((*pfat1)[lastId]== FREE)
    {
        (*pfat1)[lastId]= END;
    }
    while ((*pfat1)[lastId] != END) {
        lastId = (*pfat1)[lastId];
    }
    Document* plastDoc = new Document(blocks[lastId]);

    if((plastDoc->fcbList.size()+1)*sizeof(Fcb)>= BLOCKSIZE)
    {
        int freeBlock = pfat1->get_FreeBlock();
        if (freeBlock==FULL)
        {
            cout << "[Err]Current content is full!"<<endl;
            return false;
        }
        (*pfat1)[lastId] = freeBlock;
        (*pfat1)[freeBlock] = END;
        delete plastDoc;
        plastDoc = new Document(blocks[lastId]);
    ///Step2
        plastDoc->fcbList.push_back(fcb);
    }
    else
    {
        plastDoc->fcbList.push_back(fcb);
    }
#ifdef DEBUG
    //cout << "size:" << plastDoc->fcbList.size()<<endl;
    //cout << plastDoc->fcbList[0].filename<<endl;
#endif

    delete plastDoc;
    return true;

}